

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarking.cpp
# Opt level: O0

void bench_interpolate_step
               (vector<void_(*)(int,_int,_response_layer_*,_response_layer_*,_response_layer_*,_float_*),_std::allocator<void_(*)(int,_int,_response_layer_*,_response_layer_*,_response_layer_*,_float_*)>_>
                *functions,fasthessian *fh,
               vector<benchmark_data,_std::allocator<benchmark_data>_> *data)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  vector<benchmark_data,_std::allocator<benchmark_data>_> *in_RDX;
  benchmark_data *in_RSI;
  vector<void_(*)(int,_int,_response_layer_*,_response_layer_*,_response_layer_*,_float_*),_std::allocator<void_(*)(int,_int,_response_layer_*,_response_layer_*,_response_layer_*,_float_*)>_>
  *in_RDI;
  int c;
  int r;
  int i;
  int o;
  response_layer *top;
  response_layer *middle;
  response_layer *bottom;
  int filter_map [3] [4];
  int limit;
  int counter;
  int j;
  ulong in_stack_ffffffffffffff18;
  reference in_stack_ffffffffffffff20;
  response_layer *in_stack_ffffffffffffff28;
  reference in_stack_ffffffffffffff30;
  ulong in_stack_ffffffffffffff38;
  reference in_stack_ffffffffffffff40;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_58 [6];
  response_layer *in_stack_ffffffffffffffc0;
  response_layer *in_stack_ffffffffffffffc8;
  response_layer *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd8;
  int row;
  int iVar6;
  int iVar7;
  
  for (iVar7 = 0; uVar3 = (ulong)iVar7,
      sVar4 = std::
              vector<void_(*)(int,_int,_response_layer_*,_response_layer_*,_response_layer_*,_float_*),_std::allocator<void_(*)(int,_int,_response_layer_*,_response_layer_*,_response_layer_*,_float_*)>_>
              ::size(in_RDI), uVar3 < sVar4; iVar7 = iVar7 + 1) {
    iVar6 = 1;
    row = 4;
    memcpy(local_58,&DAT_001cb1a0,0x30);
    for (local_74 = 0; local_74 < *(int *)(in_RSI->image_name + 0x48); local_74 = local_74 + 1) {
      for (local_78 = 0; local_78 < 2; local_78 = local_78 + 1) {
        lVar1 = *(long *)(in_RSI->image_name +
                         (long)local_58[(long)local_74 * 4 + (long)(local_78 + 2)] * 8 + 8);
        for (local_7c = 0; local_7c < *(int *)(lVar1 + 8); local_7c = local_7c + 1) {
          for (local_80 = 0; local_80 < *(int *)(lVar1 + 4); local_80 = local_80 + 1) {
            bVar2 = is_extremum((int)in_stack_ffffffffffffff40,
                                (int)(in_stack_ffffffffffffff38 >> 0x20),
                                (response_layer *)in_stack_ffffffffffffff30,
                                in_stack_ffffffffffffff28,
                                (response_layer *)in_stack_ffffffffffffff20,
                                (float)(in_stack_ffffffffffffff18 >> 0x20));
            if (bVar2) {
              std::
              vector<void_(*)(int,_int,_response_layer_*,_response_layer_*,_response_layer_*,_float_*),_std::allocator<void_(*)(int,_int,_response_layer_*,_response_layer_*,_response_layer_*,_float_*)>_>
              ::operator[](in_RDI,(long)iVar7);
              std::vector<benchmark_data,_std::allocator<benchmark_data>_>::operator[]
                        (in_RDX,(long)iVar7);
              perf_interpolate_step
                        ((_func_void_int_int_response_layer_ptr_response_layer_ptr_response_layer_ptr_float_ptr
                          *)CONCAT44(iVar7,iVar6),row,in_stack_ffffffffffffffd8,
                         in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                         in_stack_ffffffffffffffc0,in_RSI);
              iVar6 = iVar6 + 1;
              if (iVar6 == row) {
                local_80 = *(int *)(lVar1 + 4);
                local_7c = *(int *)(lVar1 + 8);
                local_78 = 2;
                local_74 = *(int *)(in_RSI->image_name + 0x48);
              }
            }
          }
        }
      }
    }
    in_stack_ffffffffffffff18 = (ulong)iVar6;
    in_stack_ffffffffffffff20 =
         std::vector<benchmark_data,_std::allocator<benchmark_data>_>::operator[]
                   (in_RDX,(long)iVar7);
    in_stack_ffffffffffffff20->avg_cycles =
         in_stack_ffffffffffffff20->avg_cycles / in_stack_ffffffffffffff18;
    in_stack_ffffffffffffff28 = (response_layer *)(long)iVar6;
    in_stack_ffffffffffffff30 =
         std::vector<benchmark_data,_std::allocator<benchmark_data>_>::operator[]
                   (in_RDX,(long)iVar7);
    in_stack_ffffffffffffff30->max_cycles =
         in_stack_ffffffffffffff30->max_cycles / (ulong)in_stack_ffffffffffffff28;
    in_stack_ffffffffffffff38 = (ulong)iVar6;
    in_stack_ffffffffffffff40 =
         std::vector<benchmark_data,_std::allocator<benchmark_data>_>::operator[]
                   (in_RDX,(long)iVar7);
    in_stack_ffffffffffffff40->min_cycles =
         in_stack_ffffffffffffff40->min_cycles / in_stack_ffffffffffffff38;
    pvVar5 = std::vector<benchmark_data,_std::allocator<benchmark_data>_>::operator[]
                       (in_RDX,(long)iVar7);
    pvVar5->flops_per_cycle = pvVar5->flops_per_cycle / (double)iVar6;
  }
  return;
}

Assistant:

void bench_interpolate_step(const std::vector<void (*)(int, int, struct response_layer *, struct response_layer *, struct response_layer *, float[3])> &functions, 
                            struct fasthessian *fh, 
                            std::vector<struct benchmark_data> &data) {
    
    assert(functions.size() == data.size());

    // Iterating through all functions that should be benchmarked
    for (int j = 0; j < functions.size(); ++j) {

        int counter = 1;
        // Specifies how many times the benchmarikng for interpolate_step is called.
        // The average of the outcome will be taken
        int limit = 4;

        assert(fh != NULL);

        // filter index map
        const int filter_map[NUM_OCTAVES][NUM_LAYERS] = {
            {0, 1, 2, 3}, 
            {1, 3, 4, 5}, 
            {3, 5, 6, 7},
            //{5, 7, 8, 9},
            //{7, 9, 10, 11}
        };

        // getting response layers
        struct response_layer *bottom;
        struct response_layer *middle;
        struct response_layer *top;

        // iterating through all octaves and each layer of octave in window of three (top, middle, bottom)
        for (int o = 0; o < fh->octaves; ++o) {
            // TODO: (Sebastian) allow for fh->layers != 4 as well (note that fh->layers>=3 has to hold)
            for (int i = 0; i <= 1; ++i) {
                // assigning respective bottom, middle and top response layer
                bottom = fh->response_map[filter_map[o][i]];
                middle = fh->response_map[filter_map[o][i + 1]];
                top = fh->response_map[filter_map[o][i + 2]];

                // iterating over middle response layer at density of the most sparse layer (always top),
                // to find maxima accreoss scale and space
                for (int r = 0; r < top->height; ++r) {
                    for (int c = 0; c < top->width; ++c) {
                        // checking if current pixel position is local maximum in 3x3x3 maximum and above threshold
                        if (is_extremum(r, c, top, middle, bottom, fh->thresh)) {
                            perf_interpolate_step(functions[j], r, c, top, middle, bottom, data[j]);
                            counter++;
                            if (counter == limit) {
                                c = top->width;
                                r = top->height;
                                i = 2;
                                o = fh->octaves;
                            }
                        }
                    }
                }
            }
        }

        data[j].avg_cycles /= counter;
        data[j].max_cycles /= counter;
        data[j].min_cycles /= counter;
        data[j].flops_per_cycle /= counter;

    }

}